

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::~Application(Application *this)

{
  pointer piVar1;
  PathTracer *in_RDI;
  Scene *this_00;
  
  *(undefined ***)in_RDI = &PTR__Application_003bb1c8;
  if (((in_RDI->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
     (piVar1 = (in_RDI->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage, piVar1 != (pointer)0x0)) {
    PathTracer::~PathTracer(in_RDI);
    operator_delete(piVar1);
  }
  if (((in_RDI->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish != (pointer)0x0) &&
     (this_00 = (Scene *)(in_RDI->tile_samples).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish, this_00 != (Scene *)0x0)) {
    DynamicScene::Scene::~Scene(this_00);
    operator_delete(this_00);
  }
  Timeline::~Timeline((Timeline *)0x264029);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  OSDText::~OSDText((OSDText *)in_RDI);
  std::
  map<CMU462::DynamicScene::Joint_*,_CMU462::Vector3D,_std::less<CMU462::DynamicScene::Joint_*>,_std::allocator<std::pair<CMU462::DynamicScene::Joint_*const,_CMU462::Vector3D>_>_>
  ::~map((map<CMU462::DynamicScene::Joint_*,_CMU462::Vector3D,_std::less<CMU462::DynamicScene::Joint_*>,_std::allocator<std::pair<CMU462::DynamicScene::Joint_*const,_CMU462::Vector3D>_>_>
          *)0x264059);
  Renderer::~Renderer((Renderer *)in_RDI);
  return;
}

Assistant:

Application::~Application() {
  if (pathtracer != nullptr) delete pathtracer;
  if (scene != nullptr) delete scene;
}